

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O0

ssize_t __thiscall
libtorrent::aux::posix_part_file::write(posix_part_file *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  FILE *f_00;
  int64_t iVar4;
  int *piVar5;
  error_category *peVar6;
  char *__ptr;
  size_t sVar7;
  FILE *__s;
  size_t sVar8;
  undefined4 in_register_00000034;
  int in_R8D;
  FILE *in_R9;
  size_t written;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_70;
  slot_index_t local_68;
  slot_index_t slot;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_58;
  iterator i;
  undefined1 local_48 [8];
  file_pointer f;
  error_code *ec_local;
  int offset_local;
  posix_part_file *this_local;
  undefined1 auStack_20 [4];
  piece_index_t piece_local;
  span<const_char> buf_local;
  
  _auStack_20 = (char *)CONCAT44(in_register_00000034,__fd);
  this_local._4_4_ = (int)__n;
  f.ptr = in_R9;
  open_file((posix_part_file *)local_48,(open_mode)this,(error_code *)0x1);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)f.ptr);
  if (bVar1) {
    buf_local.m_len._4_4_ = 0xffffffff;
  }
  else {
    local_58._M_cur =
         (__node_type *)
         ::std::
         unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
         ::find(&this->m_piece_map,(key_type *)((long)&this_local + 4));
    local_70._M_cur =
         (__node_type *)
         ::std::
         unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
         ::end(&this->m_piece_map);
    bVar1 = ::std::__detail::operator==(&local_58,&local_70);
    if (bVar1) {
      local_68 = allocate_slot(this,this_local._4_4_);
    }
    else {
      ppVar3 = ::std::__detail::
               _Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                             *)&local_58);
      local_68.m_val = (ppVar3->second).m_val;
    }
    f_00 = file_pointer::file((file_pointer *)local_48);
    iVar4 = slot_offset(this,local_68);
    iVar2 = portable_fseeko(f_00,iVar4 + in_R8D,0);
    if (iVar2 == 0) {
      __ptr = span<const_char>::data((span<const_char> *)auStack_20);
      sVar7 = span<const_char>::size((span<const_char> *)auStack_20);
      __s = (FILE *)file_pointer::file((file_pointer *)local_48);
      sVar7 = fwrite(__ptr,1,sVar7,__s);
      sVar8 = span<const_char>::size((span<const_char> *)auStack_20);
      if (sVar7 == sVar8) {
        buf_local.m_len._4_4_ = (uint)sVar7;
      }
      else {
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        peVar6 = boost::system::generic_category();
        boost::system::error_code::assign((error_code *)f.ptr,iVar2,peVar6);
        buf_local.m_len._4_4_ = 0xffffffff;
      }
    }
    else {
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      peVar6 = boost::system::generic_category();
      boost::system::error_code::assign((error_code *)f.ptr,iVar2,peVar6);
      buf_local.m_len._4_4_ = 0xffffffff;
    }
  }
  i.
  super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  ._M_cur._4_4_ = 1;
  file_pointer::~file_pointer((file_pointer *)local_48);
  return (ulong)buf_local.m_len._4_4_;
}

Assistant:

int posix_part_file::write(span<char const> buf, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(int(buf.size()) + offset <= m_piece_size);

		auto f = open_file(open_mode::read_write, ec);
		if (ec) return -1;

		auto const i = m_piece_map.find(piece);
		slot_index_t const slot = (i == m_piece_map.end())
			? allocate_slot(piece) : i->second;

		if (portable_fseeko(f.file(), slot_offset(slot) + offset, SEEK_SET) != 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		auto const written = std::fwrite(buf.data(), 1, std::size_t(buf.size()), f.file());
		if (written != std::size_t(buf.size()))
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		return int(written);
	}